

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O1

gboolean timerSourcePrepareHelper(GTimerSource *src,gint *timeout)

{
  uint uVar1;
  long lVar2;
  gint gVar3;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> _Var4;
  long lVar5;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar6;
  
  if (((src->processEventsFlags).super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0) {
    oVar6 = QTimerInfoList::timerWait(&src->timerList);
    _Var4 = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)
            0xfffffffffff0bdc0;
    if (((undefined1  [16])
         oVar6.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> &
        (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var4 = oVar6.
              super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ._M_payload;
    }
    lVar5 = (ulong)(((long)_Var4 / 1000000) * 1000000 < (long)_Var4) + (long)_Var4 / 1000000;
    lVar2 = 0x7fffffff;
    if (lVar5 < 0x7fffffff) {
      lVar2 = lVar5;
    }
    gVar3 = -0x80000000;
    if (-0x80000000 < lVar2) {
      gVar3 = (gint)lVar2;
    }
    *timeout = gVar3;
    uVar1 = (uint)(lVar5 == 0);
  }
  else {
    *timeout = -1;
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

static gboolean timerSourcePrepareHelper(GTimerSource *src, gint *timeout)
{
    if (src->processEventsFlags & QEventLoop::X11ExcludeTimers) {
        *timeout = -1;
        return true;
    }

    auto remaining = src->timerList.timerWait().value_or(-1ms);
    *timeout = q26::saturate_cast<gint>(ceil<milliseconds>(remaining).count());

    return (*timeout == 0);
}